

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentAggregateSystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::SilentAggregateSystem::Encode(SilentAggregateSystem *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  SilentAggregateSystem *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui16NumAggregates);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_AggTyp).super_DataTypeBase);
  KDataStream::operator<<(pKVar1,this->m_ui16Padding);
  return;
}

Assistant:

void SilentAggregateSystem::Encode( KDataStream & stream ) const
{
    stream << m_ui16NumAggregates
           << KDIS_STREAM m_AggTyp
           << m_ui16Padding;
}